

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzread.c
# Opt level: O1

size_t zng_gzfread(void *buf,size_t size,size_t nitems,gzFile file)

{
  int iVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  size_t sVar4;
  
  if (((file != (gzFile)0x0 && size != 0) && (file[1].have == 0x1c4f)) &&
     ((iVar1 = *(int *)((long)&file[4].pos + 4), iVar1 == 0 || (iVar1 == -5)))) {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = size;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = nitems;
    if (SUB168(auVar2 * auVar3,8) == 0) {
      if (nitems * size != 0) {
        sVar4 = gz_read((gz_state *)file,buf,nitems * size);
        return sVar4 / size;
      }
    }
    else {
      gz_error((gz_state *)file,-2,"request does not fit in a size_t");
    }
  }
  return 0;
}

Assistant:

size_t Z_EXPORT PREFIX(gzfread)(void *buf, size_t size, size_t nitems, gzFile file) {
    size_t len;
    gz_state *state;

    /* Exit early if size is zero, also prevents potential division by zero */
    if (size == 0)
        return 0;

    /* get internal structure */
    if (file == NULL)
        return 0;
    state = (gz_state *)file;

    /* check that we're reading and that there's no (serious) error */
    if (state->mode != GZ_READ ||
            (state->err != Z_OK && state->err != Z_BUF_ERROR))
        return 0;

    /* compute bytes to read -- error on overflow */
    if (size && SIZE_MAX / size < nitems) {
        gz_error(state, Z_STREAM_ERROR, "request does not fit in a size_t");
        return 0;
    }
    len = nitems * size;

    /* read len or fewer bytes to buf, return the number of full items read */
    return len ? gz_read(state, buf, len) / size : 0;
}